

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O3

void __thiscall QCollapsibleFrame::setTitleObjectName(QCollapsibleFrame *this,QString *name)

{
  QSlotObjectBase *pQVar1;
  Data *pDVar2;
  QArrayDataPointer<char16_t> local_50;
  QCollapsibleFrame *local_38;
  QArrayDataPointer<char16_t> local_30;
  
  local_50.d = (name->d).d;
  local_50.ptr = (name->d).ptr;
  local_50.size = (name->d).size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar1 = (QSlotObjectBase *)operator_new(0x30);
  local_30.d = local_50.d;
  local_30.ptr = local_50.ptr;
  local_30.size = local_50.size;
  if (local_50.d == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDVar2 = local_50.d;
  }
  (pQVar1->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar1->m_impl =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/Additional/QCollapsibleFrame.cpp:269:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(QCollapsibleFrame **)(pQVar1 + 1) = this;
  pQVar1[1].m_impl = (ImplFn)pDVar2;
  *(char16_t **)(pQVar1 + 2) = local_50.ptr;
  pQVar1[2].m_impl = (ImplFn)local_50.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = this;
  QMetaObject::invokeMethodImpl((QObject *)this,pQVar1,QueuedConnection,(void *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  return;
}

Assistant:

void QCollapsibleFrame::setTitleObjectName(const QString &name) {
    QMetaObject::invokeMethod(
        this,
        [this, name]() {
            if (titleObjectName() != name) {
                setTitle(findChild<QWidget *>(name));
            }
        },
        Qt::QueuedConnection);
}